

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readoldpsm.c
# Opt level: O3

int it_old_psm_read_patterns(IT_PATTERN *pattern,DUMBFILE *f,int num,int size,int pchans)

{
  ushort *puVar1;
  byte bVar2;
  long lVar3;
  int32 iVar4;
  uint uVar5;
  int iVar6;
  char *ptr;
  IT_ENTRY *pIVar7;
  uint uVar8;
  uint uVar9;
  IT_ENTRY *pIVar10;
  ushort *puVar11;
  ushort *puVar12;
  IT_PATTERN *pIVar13;
  byte bVar14;
  byte bVar15;
  ushort *puVar16;
  ulong uVar17;
  
  ptr = (char *)malloc((long)size);
  if (ptr == (char *)0x0) {
    iVar6 = -1;
  }
  else {
    iVar4 = dumbfile_getnc(ptr,size,f);
    iVar6 = -1;
    if (size <= iVar4) {
      if (0 < num) {
        uVar17 = 0;
        iVar6 = 0;
        do {
          if (size <= iVar6) {
LAB_0070e25f:
            iVar6 = -1;
            goto LAB_0070e264;
          }
          pIVar13 = pattern + uVar17;
          bVar2 = ptr[(long)iVar6 + 2];
          if ((bVar2 == 0) || (ptr[(long)iVar6 + 3] == '\0')) {
            pIVar13->n_rows = 1;
            pIVar13->n_entries = 0;
          }
          else {
            puVar12 = (ushort *)(ptr + iVar6);
            uVar8 = *puVar12 + 0xf & 0xfffffff0;
            puVar1 = (ushort *)((ulong)uVar8 + (long)puVar12);
            uVar5 = (uint)bVar2;
            pIVar13->n_rows = uVar5;
            pIVar13->n_entries = uVar5;
            if (uVar8 != 0) {
              uVar9 = 0;
              puVar16 = puVar12 + 2;
              do {
                while( true ) {
                  puVar11 = (ushort *)((long)puVar16 + 1);
                  bVar14 = (byte)*puVar16;
                  if (bVar14 != 0) break;
                  uVar9 = uVar9 + 1;
                  if ((bVar2 <= uVar9) || (puVar16 = puVar11, puVar1 <= puVar11)) goto LAB_0070df21;
                }
                if (0x1f < bVar14) {
                  uVar5 = uVar5 + 1;
                  pIVar13->n_entries = uVar5;
                  if ((char)bVar14 < '\0') {
                    puVar11 = (ushort *)((long)puVar16 + 3);
                  }
                  puVar11 = (ushort *)((long)puVar11 + (ulong)((bVar14 >> 6 & 1) != 0));
                  if ((bVar14 & 0x20) != 0) {
                    if (*(byte *)((long)puVar11 + 1) == 0x28) {
                      puVar11 = puVar11 + 2;
                    }
                    else {
                      puVar11 = puVar11 + 1;
                    }
                  }
                }
                puVar16 = puVar11;
              } while (puVar11 < puVar1);
            }
LAB_0070df21:
            pIVar7 = (IT_ENTRY *)malloc((long)(int)uVar5 * 7);
            if (pIVar7 == (IT_ENTRY *)0x0) goto LAB_0070e25f;
            pIVar13->entry = pIVar7;
            pIVar10 = pIVar7;
            if (uVar8 != 0) {
              uVar5 = 0;
              puVar12 = puVar12 + 2;
LAB_0070df64:
              do {
                puVar16 = (ushort *)((long)puVar12 + 1);
                bVar14 = (byte)*puVar12;
                if (bVar14 == 0) goto LAB_0070e1fd;
                if (bVar14 < 0x20) goto LAB_0070e1ef;
                pIVar10->mask = '\0';
                pIVar10->channel = (uchar)(bVar14 & 0x1f);
                bVar15 = 0;
                if ((char)bVar14 < '\0') {
                  if (((int)(bVar14 & 0x1f) < pchans) && (*(byte *)puVar16 < 0x3c)) {
                    pIVar10->mask = '\x01';
                    pIVar10->note = *(byte *)puVar16 + 0x23;
                    bVar15 = 1;
                  }
                  if ((byte)puVar12[1] != 0) {
                    bVar15 = bVar15 | 2;
                    pIVar10->mask = bVar15;
                    pIVar10->instrument = (byte)puVar12[1];
                  }
                  puVar16 = (ushort *)((long)puVar12 + 3);
                }
                if ((bVar14 & 0x40) != 0) {
                  if ((byte)*puVar16 < 0x41) {
                    bVar15 = bVar15 | 4;
                    pIVar10->mask = bVar15;
                    pIVar10->volpan = (byte)*puVar16;
                  }
                  puVar16 = (ushort *)((long)puVar16 + 1);
                }
                if ((bVar14 & 0x20) == 0) goto LAB_0070e1e4;
                bVar14 = bVar15 + 8;
                pIVar10->mask = bVar14;
                switch((byte)*puVar16) {
                case 1:
                  pIVar10->effect = '\x1e';
                  goto LAB_0070e1d6;
                case 2:
                  pIVar10->effect = '\x04';
                  goto LAB_0070e11d;
                case 3:
                  pIVar10->effect = '\x1d';
                  goto LAB_0070e1d6;
                case 4:
                  pIVar10->effect = '\x04';
                  goto LAB_0070e172;
                default:
                  pIVar10->mask = bVar15;
                  goto LAB_0070e1de;
                case 10:
                  pIVar10->effect = '\x06';
                  bVar15 = *(byte *)((long)puVar16 + 1) | 0xf0;
                  break;
                case 0xb:
                  pIVar10->effect = '\x06';
                  goto LAB_0070e1d6;
                case 0xc:
                  pIVar10->effect = '\x05';
                  bVar15 = *(byte *)((long)puVar16 + 1) << 4 | 0xf;
                  break;
                case 0xd:
                  pIVar10->effect = '\x05';
                  goto LAB_0070e1d6;
                case 0xe:
                  pIVar10->effect = '\a';
                  goto LAB_0070e1d6;
                case 0xf:
                  pIVar10->effect = '\x13';
                  bVar15 = *(byte *)((long)puVar16 + 1) & 0xf | 0x10;
                  break;
                case 0x10:
                  pIVar10->effect = '\f';
                  goto LAB_0070e11d;
                case 0x11:
                  pIVar10->effect = '\f';
                  goto LAB_0070e172;
                case 0x14:
                  pIVar10->effect = '\b';
                  goto LAB_0070e1d6;
                case 0x15:
                  pIVar10->effect = '\x13';
                  bVar15 = *(byte *)((long)puVar16 + 1) & 0xb | 0x30;
                  break;
                case 0x16:
                  pIVar10->effect = '\v';
LAB_0070e11d:
                  bVar15 = *(byte *)((long)puVar16 + 1) << 4;
                  break;
                case 0x17:
                  pIVar10->effect = '\v';
LAB_0070e172:
                  bVar15 = *(byte *)((long)puVar16 + 1) & 0xf;
                  break;
                case 0x1e:
                  pIVar10->effect = '\x12';
                  goto LAB_0070e1d6;
                case 0x1f:
                  pIVar10->effect = '\x13';
                  bVar15 = *(byte *)((long)puVar16 + 1) & 0xb | 0x40;
                  break;
                case 0x28:
                  pIVar10->effect = '\x0f';
                  bVar15 = (byte)puVar16[1];
                  puVar16 = puVar16 + 1;
                  break;
                case 0x29:
                  pIVar10->effect = '\x1f';
                  goto LAB_0070e1d6;
                case 0x2a:
                  pIVar10->effect = '\x13';
                  bVar15 = *(byte *)((long)puVar16 + 1) & 0xf | 0xc0;
                  break;
                case 0x2b:
                  pIVar10->effect = '\x13';
                  bVar15 = *(byte *)((long)puVar16 + 1) & 0xf | 0xd0;
                  break;
                case 0x32:
                  pIVar10->effect = '\x02';
                  goto LAB_0070e1d6;
                case 0x33:
                  pIVar10->effect = '\x03';
                  goto LAB_0070e1d6;
                case 0x34:
                  pIVar10->effect = '\x13';
                  bVar15 = *(byte *)((long)puVar16 + 1) & 0xf | 0xb0;
                  break;
                case 0x35:
                  pIVar10->effect = '\x13';
                  bVar15 = *(byte *)((long)puVar16 + 1) & 0xf | 0xe0;
                  break;
                case 0x3c:
                  pIVar10->effect = '\x01';
                  goto LAB_0070e1d6;
                case 0x3d:
                  pIVar10->effect = '\x14';
                  goto LAB_0070e1d6;
                case 0x46:
                  pIVar10->effect = '\n';
LAB_0070e1d6:
                  bVar15 = *(byte *)((long)puVar16 + 1);
                  break;
                case 0x47:
                  pIVar10->effect = '\x13';
                  bVar15 = *(byte *)((long)puVar16 + 1) & 0xf | 0x20;
                  break;
                case 0x48:
                  pIVar10->effect = '\x18';
                  lVar3 = (long)(int)((((int)((uint)*(byte *)((long)puVar16 + 1) << 0x1c) >> 0x1f) +
                                      (uint)*(byte *)((long)puVar16 + 1)) * 0x20) * 0x92492493;
                  pIVar10->effectvalue = (char)(uint)((ulong)lVar3 >> 0x22) - (char)(lVar3 >> 0x3f);
                  bVar15 = bVar14;
                  goto LAB_0070e1de;
                }
                pIVar10->effectvalue = bVar15;
                bVar15 = bVar14;
LAB_0070e1de:
                puVar16 = puVar16 + 1;
LAB_0070e1e4:
                if (bVar15 != 0) {
                  pIVar10 = pIVar10 + 1;
                }
LAB_0070e1ef:
                puVar12 = puVar16;
              } while (puVar16 < puVar1);
            }
LAB_0070e214:
            pIVar13->n_entries = ((int)pIVar10 - (int)pIVar7) * -0x49249249;
            iVar6 = uVar8 + iVar6;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != (uint)num);
      }
      iVar6 = 0;
    }
LAB_0070e264:
    free(ptr);
  }
  return iVar6;
LAB_0070e1fd:
  pIVar10->channel = 0xff;
  pIVar10 = pIVar10 + 1;
  uVar5 = uVar5 + 1;
  if ((bVar2 <= uVar5) || (puVar12 = puVar16, puVar1 <= puVar16)) goto LAB_0070e214;
  goto LAB_0070df64;
}

Assistant:

static int it_old_psm_read_patterns(IT_PATTERN * pattern, DUMBFILE * f, int num, int size, int pchans)
{
	int n, offset, psize, rows, chans, row, flags, channel;

	unsigned char * buffer, * ptr, * end;

	IT_ENTRY * entry;

	buffer = malloc(size);
	if (!buffer) goto error;

    if (dumbfile_getnc((char *)buffer, size, f) < size) goto error_fb;

	offset = 0;

	for (n = 0; n < num; n++) {
		IT_PATTERN * p = &pattern[n];

		if (offset >= size) goto error_fb;

		ptr = buffer + offset;
		psize = ptr[0] | (ptr[1] << 8);
		rows = ptr[2];
		chans = ptr[3];

		if (!rows || !chans) {
			p->n_rows = 1;
			p->n_entries = 0;
			continue;
		}

		psize = (psize + 15) & ~15;

		end = ptr + psize;
		ptr += 4;

		p->n_rows = rows;
		p->n_entries = rows;
		row = 0;

		while ((row < rows) && (ptr < end)) {
			flags = *ptr++;
			if (!flags) {
				row++;
				continue;
			}
			if (flags & 0xE0) {
				p->n_entries++;
				if (flags & 0x80) ptr += 2;
				if (flags & 0x40) ptr++;
				if (flags & 0x20) {
					ptr++;
					if (*ptr == 40) ptr += 3;
					else ptr++;
				}
			}
		}

		entry = malloc(p->n_entries * sizeof(*p->entry));
		if (!entry) goto error_fb;

		p->entry = entry;

		ptr = buffer + offset + 4;
		row = 0;

		while ((row < rows) && (ptr < end)) {
			flags = *ptr++;
			if (!flags) {
				IT_SET_END_ROW(entry);
				entry++;
				row++;
				continue;
			}
			if (flags & 0xE0) {
				entry->mask = 0;
				entry->channel = channel = flags & 0x1F;
				if (channel >= chans)
				{
					//channel = 0;
					//goto error_fb;
				}
				if (flags & 0x80) {
					if ((*ptr < 60) && (channel < pchans)) {
						entry->mask |= IT_ENTRY_NOTE;
						entry->note = *ptr + 35;
					}
					ptr++;
					if (*ptr) {
						entry->mask |= IT_ENTRY_INSTRUMENT;
						entry->instrument = *ptr;
					}
					ptr++;
				}
				if (flags & 0x40) {
					if (*ptr <= 64) {
						entry->mask |= IT_ENTRY_VOLPAN;
						entry->volpan = *ptr;
					}
					ptr++;
				}
				if (flags & 0x20) {
					entry->mask |= IT_ENTRY_EFFECT;

					switch (*ptr) {
						case 1:
							entry->effect = IT_XM_FINE_VOLSLIDE_UP;
							entry->effectvalue = ptr[1];
							break;

						case 2:
							entry->effect = IT_VOLUME_SLIDE;
							entry->effectvalue = (ptr[1] << 4) & 0xF0;
							break;

						case 3:
							entry->effect = IT_XM_FINE_VOLSLIDE_DOWN;
							entry->effectvalue = ptr[1];
							break;

						case 4:
							entry->effect = IT_VOLUME_SLIDE;
							entry->effectvalue = ptr[1] & 0xF;
							break;

						case 10:
							entry->effect = IT_PORTAMENTO_UP;
							entry->effectvalue = EFFECT_VALUE(0xF, ptr[1]);
							break;

						case 11:
							entry->effect = IT_PORTAMENTO_UP;
							entry->effectvalue = ptr[1];
							break;

						case 12:
							entry->effect = IT_PORTAMENTO_DOWN;
							entry->effectvalue = EFFECT_VALUE(ptr[1], 0xF);
							break;

						case 13:
							entry->effect = IT_PORTAMENTO_DOWN;
							entry->effectvalue = ptr[1];
							break;

						case 14:
							entry->effect = IT_TONE_PORTAMENTO;
							entry->effectvalue = ptr[1];
							break;

						case 15:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_SET_GLISSANDO_CONTROL, ptr[1] & 15);
							break;

						case 16:
							entry->effect = IT_VOLSLIDE_TONEPORTA;
							entry->effectvalue = ptr[1] << 4;
							break;

						case 17:
							entry->effect = IT_VOLSLIDE_TONEPORTA;
							entry->effectvalue = ptr[1] & 0xF;
							break;

						case 20:
							entry->effect = IT_VIBRATO;
							entry->effectvalue = ptr[1];
							break;

						case 21:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_SET_VIBRATO_WAVEFORM, ptr[1] & 11);
							break;

						case 22:
							entry->effect = IT_VOLSLIDE_VIBRATO;
							entry->effectvalue = ptr[1] << 4;
							break;

						case 23:
							entry->effect = IT_VOLSLIDE_VIBRATO;
							entry->effectvalue = ptr[1] & 0xF;
							break;

						case 30:
							entry->effect = IT_TREMOLO;
							entry->effectvalue = ptr[1];
							break;

						case 31:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_SET_TREMOLO_WAVEFORM, ptr[1] & 11);
							break;

						case 40:
							entry->effect = IT_SET_SAMPLE_OFFSET;
							entry->effectvalue = ptr[2];
							ptr += 2;
							break;

						case 41:
							entry->effect = IT_XM_RETRIGGER_NOTE;
							entry->effectvalue = ptr[1];
							break;

						case 42:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_DELAYED_NOTE_CUT, ptr[1] & 0xF);
							break;

						case 43:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_NOTE_DELAY, ptr[1] & 0xF);
							break;

						case 50:
							entry->effect = IT_JUMP_TO_ORDER;
							entry->effectvalue = ptr[1];
							break;

						case 51:
							entry->effect = IT_BREAK_TO_ROW;
							entry->effectvalue = ptr[1];
							break;

						case 52:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_PATTERN_LOOP, ptr[1] & 0xF);
							break;

						case 53:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_PATTERN_DELAY, ptr[1] & 0xF);
							break;

						case 60:
							entry->effect = IT_SET_SPEED;
							entry->effectvalue = ptr[1];
							break;

						case 61:
							entry->effect = IT_SET_SONG_TEMPO;
							entry->effectvalue = ptr[1];
							break;

						case 70:
							entry->effect = IT_ARPEGGIO;
							entry->effectvalue = ptr[1];
							break;

						case 71:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_FINETUNE, ptr[1] & 0xF);
							break;

						case 72:
							/* "balance" ... panning? */
							entry->effect = IT_SET_PANNING;
							entry->effectvalue = ((ptr[1] - ((ptr[1] & 8) >> 3)) << 5) / 7;
							break;

						default:
							entry->mask &= ~IT_ENTRY_EFFECT;
					}

					ptr += 2;
				}
				if (entry->mask) entry++;
			}
		}

		p->n_entries = (int)(entry - p->entry);
		offset += psize;
	}

	free(buffer);

	return 0;

error_fb:
	free(buffer);
error:
	return -1;
}